

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O0

void skiwi::anon_unknown_4::print_ptr
               (uint64_t rax2,ostream *out,
               shared_ptr<skiwi::environment<skiwi::environment_entry>_> *env,repl_data *rd,
               context *p_ctxt)

{
  pointer *this;
  _anonymous_namespace_ *this_00;
  bool bVar1;
  reference pvVar2;
  streamsize sVar3;
  ulong uVar4;
  void *pvVar5;
  uint64_t uVar6;
  ostream *poVar7;
  undefined8 uVar8;
  reference pbVar9;
  uint64_t i_00;
  uint64_t i_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  string local_5e0;
  value_type local_5c0;
  shared_ptr<skiwi::environment<skiwi::environment_entry>_> local_5a0;
  int local_590;
  int local_58c;
  ulong uStack_588;
  runtime_error re;
  uint64_t error_id;
  shared_ptr<skiwi::environment<skiwi::environment_entry>_> local_560;
  value_type local_550;
  shared_ptr<skiwi::environment<skiwi::environment_entry>_> local_530;
  value_type local_520;
  value_type local_500;
  value_type local_4e0;
  value_type local_4c0;
  int local_4a0;
  char local_49a;
  byte local_499;
  undefined1 local_498 [7];
  uchar ch_2;
  value_type local_478;
  value_type local_458;
  value_type local_438;
  string local_418;
  value_type local_3f8;
  value_type local_3d8;
  unsigned_long local_3b8;
  uint64_t name_address;
  char *local_390;
  char *ch_1;
  char *local_368;
  char *ch;
  __normal_iterator<skiwi::(anonymous_namespace)::task_*,_std::vector<skiwi::(anonymous_namespace)::task,_std::allocator<skiwi::(anonymous_namespace)::task>_>_>
  local_358;
  __normal_iterator<skiwi::(anonymous_namespace)::task_*,_std::vector<skiwi::(anonymous_namespace)::task,_std::allocator<skiwi::(anonymous_namespace)::task>_>_>
  local_350;
  int local_344;
  unsigned_long local_340;
  uint64_t item;
  size_type sStack_330;
  int i;
  size_t idx0_1;
  task *local_308;
  __normal_iterator<skiwi::(anonymous_namespace)::task_*,_std::vector<skiwi::(anonymous_namespace)::task,_std::allocator<skiwi::(anonymous_namespace)::task>_>_>
  local_300;
  __normal_iterator<skiwi::(anonymous_namespace)::task_*,_std::vector<skiwi::(anonymous_namespace)::task,_std::allocator<skiwi::(anonymous_namespace)::task>_>_>
  local_2f8;
  int local_2f0 [2];
  size_type local_2e8;
  size_t idx0;
  uint64_t local_2c0;
  uint64_t second;
  uint64_t first;
  value_type local_290;
  double *local_270;
  double *d;
  uint64_t header;
  uint64_t *addr;
  long local_238;
  int64_t value;
  stringstream local_228 [8];
  stringstream str;
  ostream local_218 [376];
  undefined1 local_a0 [8];
  string txt;
  int second_item_of_pair;
  uint64_t rax;
  undefined1 local_60 [8];
  vector<skiwi::(anonymous_namespace)::task,_std::allocator<skiwi::(anonymous_namespace)::task>_>
  todo;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  texts;
  context *p_ctxt_local;
  repl_data *rd_local;
  shared_ptr<skiwi::environment<skiwi::environment_entry>_> *env_local;
  ostream *out_local;
  uint64_t rax2_local;
  
  out_local = (ostream *)rax2;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&todo.
               super__Vector_base<skiwi::(anonymous_namespace)::task,_std::allocator<skiwi::(anonymous_namespace)::task>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<skiwi::(anonymous_namespace)::task,_std::allocator<skiwi::(anonymous_namespace)::task>_>::
  vector((vector<skiwi::(anonymous_namespace)::task,_std::allocator<skiwi::(anonymous_namespace)::task>_>
          *)local_60);
  std::vector<skiwi::(anonymous_namespace)::task,std::allocator<skiwi::(anonymous_namespace)::task>>
  ::emplace_back<unsigned_long&>
            ((vector<skiwi::(anonymous_namespace)::task,std::allocator<skiwi::(anonymous_namespace)::task>>
              *)local_60,(unsigned_long *)&out_local);
  while (bVar1 = std::
                 vector<skiwi::(anonymous_namespace)::task,_std::allocator<skiwi::(anonymous_namespace)::task>_>
                 ::empty((vector<skiwi::(anonymous_namespace)::task,_std::allocator<skiwi::(anonymous_namespace)::task>_>
                          *)local_60), ((bVar1 ^ 0xffU) & 1) != 0) {
    pvVar2 = std::
             vector<skiwi::(anonymous_namespace)::task,_std::allocator<skiwi::(anonymous_namespace)::task>_>
             ::back((vector<skiwi::(anonymous_namespace)::task,_std::allocator<skiwi::(anonymous_namespace)::task>_>
                     *)local_60);
    this_00 = (_anonymous_namespace_ *)pvVar2->rax;
    pvVar2 = std::
             vector<skiwi::(anonymous_namespace)::task,_std::allocator<skiwi::(anonymous_namespace)::task>_>
             ::back((vector<skiwi::(anonymous_namespace)::task,_std::allocator<skiwi::(anonymous_namespace)::task>_>
                     *)local_60);
    txt.field_2._12_4_ = pvVar2->second_item_of_pair;
    pvVar2 = std::
             vector<skiwi::(anonymous_namespace)::task,_std::allocator<skiwi::(anonymous_namespace)::task>_>
             ::back((vector<skiwi::(anonymous_namespace)::task,_std::allocator<skiwi::(anonymous_namespace)::task>_>
                     *)local_60);
    std::__cxx11::string::string((string *)local_a0,(string *)pvVar2);
    std::
    vector<skiwi::(anonymous_namespace)::task,_std::allocator<skiwi::(anonymous_namespace)::task>_>
    ::pop_back((vector<skiwi::(anonymous_namespace)::task,_std::allocator<skiwi::(anonymous_namespace)::task>_>
                *)local_60);
    std::__cxx11::stringstream::stringstream(local_228);
    sVar3 = std::ios_base::precision((ios_base *)(out + *(long *)(*(long *)out + -0x18)));
    value._4_4_ = std::setprecision((int)sVar3);
    std::operator<<(local_218,value._4_4_);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&todo.
                      super__Vector_base<skiwi::(anonymous_namespace)::task,_std::allocator<skiwi::(anonymous_namespace)::task>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_a0);
LAB_004c61cb:
      local_590 = 0;
    }
    else {
      if (((ulong)this_00 & 1) == 0) {
        local_238 = (long)this_00 >> 1;
        std::ostream::operator<<(local_218,local_238);
        std::__cxx11::stringstream::str();
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&todo.
                        super__Vector_base<skiwi::(anonymous_namespace)::task,_std::allocator<skiwi::(anonymous_namespace)::task>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)&addr);
        std::__cxx11::string::~string((string *)&addr);
        goto LAB_004c61cb;
      }
      if (((ulong)this_00 & 7) == 5) {
        header = (uint64_t)get_address_from_block((uint64_t)this_00);
        d = *(double **)header;
        bVar1 = block_header_is_flonum((uint64_t)d);
        if (bVar1) {
          uVar6 = get_block_size((uint64_t)d);
          if (uVar6 != 1) {
            __assert_fail("get_block_size(header) == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi/runtime.cpp"
                          ,0x5d,
                          "void skiwi::(anonymous namespace)::print_ptr(uint64_t, std::ostream &, std::shared_ptr< ::skiwi::environment< ::skiwi::environment_entry>>, const repl_data &, const context *)"
                         );
          }
          local_270 = (double *)(header + 8);
          pvVar5 = (void *)std::ostream::operator<<(local_218,std::defaultfloat);
          std::ostream::operator<<(pvVar5,*local_270);
          std::__cxx11::stringstream::str();
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&todo.
                          super__Vector_base<skiwi::(anonymous_namespace)::task,_std::allocator<skiwi::(anonymous_namespace)::task>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_290);
          std::__cxx11::string::~string((string *)&local_290);
        }
        else {
          bVar1 = block_header_is_closure((uint64_t)d);
          if (bVar1) {
            std::operator<<(local_218,"<lambda>");
            std::__cxx11::stringstream::str();
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&todo.
                            super__Vector_base<skiwi::(anonymous_namespace)::task,_std::allocator<skiwi::(anonymous_namespace)::task>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)&first)
            ;
            std::__cxx11::string::~string((string *)&first);
          }
          else {
            bVar1 = block_header_is_pair((uint64_t)d);
            if (bVar1) {
              uVar6 = get_block_size((uint64_t)d);
              if (uVar6 != 2) {
                __assert_fail("get_block_size(header) == 2",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi/runtime.cpp"
                              ,0x6d,
                              "void skiwi::(anonymous namespace)::print_ptr(uint64_t, std::ostream &, std::shared_ptr< ::skiwi::environment< ::skiwi::environment_entry>>, const repl_data &, const context *)"
                             );
              }
              second = *(uint64_t *)(header + 8);
              local_2c0 = *(uint64_t *)(header + 0x10);
              if (txt.field_2._12_4_ == 0) {
                std::operator<<(local_218,"(");
                std::__cxx11::stringstream::str();
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&todo.
                                super__Vector_base<skiwi::(anonymous_namespace)::task,_std::allocator<skiwi::(anonymous_namespace)::task>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                            (value_type *)&idx0);
                std::__cxx11::string::~string((string *)&idx0);
              }
              local_2e8 = std::
                          vector<skiwi::(anonymous_namespace)::task,_std::allocator<skiwi::(anonymous_namespace)::task>_>
                          ::size((vector<skiwi::(anonymous_namespace)::task,_std::allocator<skiwi::(anonymous_namespace)::task>_>
                                  *)local_60);
              local_2f0[1] = 0;
              std::
              vector<skiwi::(anonymous_namespace)::task,std::allocator<skiwi::(anonymous_namespace)::task>>
              ::emplace_back<unsigned_long&,int>
                        ((vector<skiwi::(anonymous_namespace)::task,std::allocator<skiwi::(anonymous_namespace)::task>>
                          *)local_60,&second,local_2f0 + 1);
              if (local_2c0 != 0x1f) {
                bVar1 = is_pair(local_2c0);
                if (bVar1) {
                  std::
                  vector<skiwi::(anonymous_namespace)::task,std::allocator<skiwi::(anonymous_namespace)::task>>
                  ::emplace_back<char_const(&)[2]>
                            ((vector<skiwi::(anonymous_namespace)::task,std::allocator<skiwi::(anonymous_namespace)::task>>
                              *)local_60,(char (*) [2])0x4e55d0);
                }
                else {
                  std::
                  vector<skiwi::(anonymous_namespace)::task,std::allocator<skiwi::(anonymous_namespace)::task>>
                  ::emplace_back<char_const(&)[4]>
                            ((vector<skiwi::(anonymous_namespace)::task,std::allocator<skiwi::(anonymous_namespace)::task>>
                              *)local_60,(char (*) [4])" . ");
                }
                local_2f0[0] = 1;
                std::
                vector<skiwi::(anonymous_namespace)::task,std::allocator<skiwi::(anonymous_namespace)::task>>
                ::emplace_back<unsigned_long&,int>
                          ((vector<skiwi::(anonymous_namespace)::task,std::allocator<skiwi::(anonymous_namespace)::task>>
                            *)local_60,&local_2c0,local_2f0);
              }
              if (txt.field_2._12_4_ == 0) {
                std::
                vector<skiwi::(anonymous_namespace)::task,std::allocator<skiwi::(anonymous_namespace)::task>>
                ::emplace_back<char_const(&)[2]>
                          ((vector<skiwi::(anonymous_namespace)::task,std::allocator<skiwi::(anonymous_namespace)::task>>
                            *)local_60,(char (*) [2])0x4e47a0);
              }
              local_300._M_current =
                   (task *)std::
                           vector<skiwi::(anonymous_namespace)::task,_std::allocator<skiwi::(anonymous_namespace)::task>_>
                           ::begin((vector<skiwi::(anonymous_namespace)::task,_std::allocator<skiwi::(anonymous_namespace)::task>_>
                                    *)local_60);
              local_2f8 = __gnu_cxx::
                          __normal_iterator<skiwi::(anonymous_namespace)::task_*,_std::vector<skiwi::(anonymous_namespace)::task,_std::allocator<skiwi::(anonymous_namespace)::task>_>_>
                          ::operator+(&local_300,local_2e8);
              local_308 = (task *)std::
                                  vector<skiwi::(anonymous_namespace)::task,_std::allocator<skiwi::(anonymous_namespace)::task>_>
                                  ::end((vector<skiwi::(anonymous_namespace)::task,_std::allocator<skiwi::(anonymous_namespace)::task>_>
                                         *)local_60);
              std::
              reverse<__gnu_cxx::__normal_iterator<skiwi::(anonymous_namespace)::task*,std::vector<skiwi::(anonymous_namespace)::task,std::allocator<skiwi::(anonymous_namespace)::task>>>>
                        (local_2f8,
                         (__normal_iterator<skiwi::(anonymous_namespace)::task_*,_std::vector<skiwi::(anonymous_namespace)::task,_std::allocator<skiwi::(anonymous_namespace)::task>_>_>
                          )local_308);
            }
            else {
              bVar1 = block_header_is_vector((uint64_t)d);
              if (bVar1) {
                std::operator<<(local_218,"#(");
                std::__cxx11::stringstream::str();
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&todo.
                                super__Vector_base<skiwi::(anonymous_namespace)::task,_std::allocator<skiwi::(anonymous_namespace)::task>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                            (value_type *)&idx0_1);
                std::__cxx11::string::~string((string *)&idx0_1);
                sStack_330 = std::
                             vector<skiwi::(anonymous_namespace)::task,_std::allocator<skiwi::(anonymous_namespace)::task>_>
                             ::size((vector<skiwi::(anonymous_namespace)::task,_std::allocator<skiwi::(anonymous_namespace)::task>_>
                                     *)local_60);
                for (item._4_4_ = 0; uVar4 = (ulong)item._4_4_, uVar6 = get_block_size((uint64_t)d),
                    uVar4 < uVar6; item._4_4_ = item._4_4_ + 1) {
                  if (item._4_4_ != 0) {
                    std::
                    vector<skiwi::(anonymous_namespace)::task,std::allocator<skiwi::(anonymous_namespace)::task>>
                    ::emplace_back<char_const(&)[2]>
                              ((vector<skiwi::(anonymous_namespace)::task,std::allocator<skiwi::(anonymous_namespace)::task>>
                                *)local_60,(char (*) [2])0x4e55d0);
                  }
                  local_340 = *(unsigned_long *)(header + 8 + (long)item._4_4_ * 8);
                  local_344 = 0;
                  std::
                  vector<skiwi::(anonymous_namespace)::task,std::allocator<skiwi::(anonymous_namespace)::task>>
                  ::emplace_back<unsigned_long&,int>
                            ((vector<skiwi::(anonymous_namespace)::task,std::allocator<skiwi::(anonymous_namespace)::task>>
                              *)local_60,&local_340,&local_344);
                }
                std::
                vector<skiwi::(anonymous_namespace)::task,std::allocator<skiwi::(anonymous_namespace)::task>>
                ::emplace_back<char_const(&)[2]>
                          ((vector<skiwi::(anonymous_namespace)::task,std::allocator<skiwi::(anonymous_namespace)::task>>
                            *)local_60,(char (*) [2])0x4e47a0);
                local_358._M_current =
                     (task *)std::
                             vector<skiwi::(anonymous_namespace)::task,_std::allocator<skiwi::(anonymous_namespace)::task>_>
                             ::begin((vector<skiwi::(anonymous_namespace)::task,_std::allocator<skiwi::(anonymous_namespace)::task>_>
                                      *)local_60);
                local_350 = __gnu_cxx::
                            __normal_iterator<skiwi::(anonymous_namespace)::task_*,_std::vector<skiwi::(anonymous_namespace)::task,_std::allocator<skiwi::(anonymous_namespace)::task>_>_>
                            ::operator+(&local_358,sStack_330);
                ch = (char *)std::
                             vector<skiwi::(anonymous_namespace)::task,_std::allocator<skiwi::(anonymous_namespace)::task>_>
                             ::end((vector<skiwi::(anonymous_namespace)::task,_std::allocator<skiwi::(anonymous_namespace)::task>_>
                                    *)local_60);
                std::
                reverse<__gnu_cxx::__normal_iterator<skiwi::(anonymous_namespace)::task*,std::vector<skiwi::(anonymous_namespace)::task,std::allocator<skiwi::(anonymous_namespace)::task>>>>
                          (local_350,
                           (__normal_iterator<skiwi::(anonymous_namespace)::task_*,_std::vector<skiwi::(anonymous_namespace)::task,_std::allocator<skiwi::(anonymous_namespace)::task>_>_>
                            )ch);
              }
              else {
                bVar1 = block_header_is_string((uint64_t)d);
                if (bVar1) {
                  std::operator<<(local_218,"\"");
                  local_368 = (char *)(header + 8);
                  std::operator<<(local_218,local_368);
                  std::operator<<(local_218,"\"");
                  std::__cxx11::stringstream::str();
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&todo.
                                  super__Vector_base<skiwi::(anonymous_namespace)::task,_std::allocator<skiwi::(anonymous_namespace)::task>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              (value_type *)&ch_1);
                  std::__cxx11::string::~string((string *)&ch_1);
                }
                else {
                  bVar1 = block_header_is_symbol((uint64_t)d);
                  if (bVar1) {
                    local_390 = (char *)(header + 8);
                    std::operator<<(local_218,local_390);
                    std::__cxx11::stringstream::str();
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&todo.
                                    super__Vector_base<skiwi::(anonymous_namespace)::task,_std::allocator<skiwi::(anonymous_namespace)::task>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                (value_type *)&name_address);
                    std::__cxx11::string::~string((string *)&name_address);
                  }
                  else {
                    bVar1 = block_header_is_port((uint64_t)d);
                    if (bVar1) {
                      local_3b8 = *(unsigned_long *)(header + 0x10);
                      std::operator<<(local_218,"<port>: ");
                      std::__cxx11::stringstream::str();
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)&todo.
                                      super__Vector_base<skiwi::(anonymous_namespace)::task,_std::allocator<skiwi::(anonymous_namespace)::task>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_3d8)
                      ;
                      std::__cxx11::string::~string((string *)&local_3d8);
                      std::
                      vector<skiwi::(anonymous_namespace)::task,std::allocator<skiwi::(anonymous_namespace)::task>>
                      ::emplace_back<unsigned_long&,int&>
                                ((vector<skiwi::(anonymous_namespace)::task,std::allocator<skiwi::(anonymous_namespace)::task>>
                                  *)local_60,&local_3b8,(int *)(txt.field_2._M_local_buf + 0xc));
                    }
                    else {
                      bVar1 = block_header_is_promise((uint64_t)d);
                      if (bVar1) {
                        std::operator<<(local_218,"<promise>");
                        std::__cxx11::stringstream::str();
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)&todo.
                                        super__Vector_base<skiwi::(anonymous_namespace)::task,_std::allocator<skiwi::(anonymous_namespace)::task>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                    &local_3f8);
                        std::__cxx11::string::~string((string *)&local_3f8);
                      }
                      else {
                        poVar7 = std::operator<<(local_218,"<unknown ");
                        (anonymous_namespace)::uint64_to_hex_abi_cxx11_(&local_418,this_00,i_00);
                        poVar7 = std::operator<<(poVar7,(string *)&local_418);
                        std::operator<<(poVar7,">");
                        std::__cxx11::string::~string((string *)&local_418);
                        std::__cxx11::stringstream::str();
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)&todo.
                                        super__Vector_base<skiwi::(anonymous_namespace)::task,_std::allocator<skiwi::(anonymous_namespace)::task>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                    &local_438);
                        std::__cxx11::string::~string((string *)&local_438);
                      }
                    }
                  }
                }
              }
            }
          }
        }
        goto LAB_004c61cb;
      }
      if (this_00 == (_anonymous_namespace_ *)0xf) {
        std::operator<<(local_218,"#t");
        std::__cxx11::stringstream::str();
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&todo.
                        super__Vector_base<skiwi::(anonymous_namespace)::task,_std::allocator<skiwi::(anonymous_namespace)::task>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_458);
        std::__cxx11::string::~string((string *)&local_458);
        goto LAB_004c61cb;
      }
      if (this_00 == (_anonymous_namespace_ *)0x7) {
        std::operator<<(local_218,"#f");
        std::__cxx11::stringstream::str();
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&todo.
                        super__Vector_base<skiwi::(anonymous_namespace)::task,_std::allocator<skiwi::(anonymous_namespace)::task>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_478);
        std::__cxx11::string::~string((string *)&local_478);
        goto LAB_004c61cb;
      }
      if (this_00 == (_anonymous_namespace_ *)0x1f) {
        std::operator<<(local_218,"()");
        std::__cxx11::stringstream::str();
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&todo.
                        super__Vector_base<skiwi::(anonymous_namespace)::task,_std::allocator<skiwi::(anonymous_namespace)::task>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_498);
        std::__cxx11::string::~string((string *)local_498);
        goto LAB_004c61cb;
      }
      if (((ulong)this_00 & 0xff) == 0x17) {
        local_499 = (byte)((ulong)this_00 >> 8);
        if ((local_499 < 0x20) || (0x7e < local_499)) {
          poVar7 = std::operator<<(local_218,"#\\");
          uVar8 = std::ostream::operator<<(poVar7,std::fixed);
          local_49a = (char)std::setfill<char>('0');
          poVar7 = std::operator<<(uVar8,local_49a);
          local_4a0 = (int)std::setw(3);
          poVar7 = std::operator<<(poVar7,(_Setw)local_4a0);
          pvVar5 = (void *)std::ostream::operator<<(poVar7,(uint)local_499);
          std::ostream::operator<<(pvVar5,std::defaultfloat);
        }
        else {
          poVar7 = std::operator<<(local_218,"#\\");
          std::operator<<(poVar7,local_499);
        }
        std::__cxx11::stringstream::str();
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&todo.
                        super__Vector_base<skiwi::(anonymous_namespace)::task,_std::allocator<skiwi::(anonymous_namespace)::task>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_4c0);
        std::__cxx11::string::~string((string *)&local_4c0);
        goto LAB_004c61cb;
      }
      if (this_00 == (_anonymous_namespace_ *)0x27) {
        std::operator<<(local_218,"#undefined");
        std::__cxx11::stringstream::str();
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&todo.
                        super__Vector_base<skiwi::(anonymous_namespace)::task,_std::allocator<skiwi::(anonymous_namespace)::task>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_4e0);
        std::__cxx11::string::~string((string *)&local_4e0);
        goto LAB_004c61cb;
      }
      if (this_00 == (_anonymous_namespace_ *)0x4f) goto LAB_004c61cb;
      if (this_00 == (_anonymous_namespace_ *)0x47) {
        std::operator<<(local_218,"#eof");
        std::__cxx11::stringstream::str();
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&todo.
                        super__Vector_base<skiwi::(anonymous_namespace)::task,_std::allocator<skiwi::(anonymous_namespace)::task>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_500);
        std::__cxx11::string::~string((string *)&local_500);
        goto LAB_004c61cb;
      }
      if (((ulong)this_00 & 7) == 3) {
        std::operator<<(local_218,"<procedure>");
        std::__cxx11::stringstream::str();
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&todo.
                        super__Vector_base<skiwi::(anonymous_namespace)::task,_std::allocator<skiwi::(anonymous_namespace)::task>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_520);
        std::__cxx11::string::~string((string *)&local_520);
        goto LAB_004c61cb;
      }
      if (this_00 == (_anonymous_namespace_ *)0x57) {
        std::operator<<(local_218,"unknown variable");
        if (p_ctxt != (context *)0x0) {
          std::operator<<(local_218,": ");
          std::shared_ptr<skiwi::environment<skiwi::environment_entry>_>::shared_ptr(&local_530,env)
          ;
          print_last_global_variable_used(local_218,&local_530,rd,p_ctxt);
          std::shared_ptr<skiwi::environment<skiwi::environment_entry>_>::~shared_ptr(&local_530);
        }
        std::__cxx11::stringstream::str();
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&todo.
                        super__Vector_base<skiwi::(anonymous_namespace)::task,_std::allocator<skiwi::(anonymous_namespace)::task>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_550);
        std::__cxx11::string::~string((string *)&local_550);
        goto LAB_004c61cb;
      }
      if (this_00 == (_anonymous_namespace_ *)0x3f) {
        std::operator<<(local_218,"compiler error, to check: ");
        if (p_ctxt != (context *)0x0) {
          std::operator<<(local_218,": ");
          std::shared_ptr<skiwi::environment<skiwi::environment_entry>_>::shared_ptr(&local_560,env)
          ;
          print_last_global_variable_used(local_218,&local_560,rd,p_ctxt);
          std::shared_ptr<skiwi::environment<skiwi::environment_entry>_>::~shared_ptr(&local_560);
        }
        std::__cxx11::stringstream::str();
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&todo.
                        super__Vector_base<skiwi::(anonymous_namespace)::task,_std::allocator<skiwi::(anonymous_namespace)::task>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)&error_id);
        std::__cxx11::string::~string((string *)&error_id);
        goto LAB_004c61cb;
      }
      if (((ulong)this_00 & 0xff) != 0x2f) {
        poVar7 = std::operator<<(local_218,"<unknown ");
        (anonymous_namespace)::uint64_to_hex_abi_cxx11_(&local_5e0,this_00,i_01);
        poVar7 = std::operator<<(poVar7,(string *)&local_5e0);
        std::operator<<(poVar7,">");
        std::__cxx11::string::~string((string *)&local_5e0);
        std::__cxx11::stringstream::str();
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&todo.
                        super__Vector_base<skiwi::(anonymous_namespace)::task,_std::allocator<skiwi::(anonymous_namespace)::task>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)&__range2);
        std::__cxx11::string::~string((string *)&__range2);
        goto LAB_004c61cb;
      }
      uStack_588 = (ulong)this_00 >> 8 & 0xff;
      local_58c = (int)uStack_588;
      if (local_58c != 0) {
        std::operator<<(local_218,"runtime error: ");
        switch(local_58c) {
        case 1:
          std::operator<<(local_218,"<lambda>: invalid number of arguments");
          break;
        case 2:
          std::operator<<(local_218,"+: contract violation");
          break;
        case 3:
          std::operator<<(local_218,"add1: contract violation");
          break;
        case 4:
          std::operator<<(local_218,"=: contract violation");
          break;
        case 5:
          std::operator<<(local_218,"!=: contract violation");
          break;
        case 6:
          std::operator<<(local_218,"<: contract violation");
          break;
        case 7:
          std::operator<<(local_218,"<=: contract violation");
          break;
        case 8:
          std::operator<<(local_218,">: contract violation");
          break;
        case 9:
          std::operator<<(local_218,">=: contract violation");
          break;
        case 10:
          std::operator<<(local_218,"/: contract violation");
          break;
        case 0xb:
          std::operator<<(local_218,"*: contract violation");
          break;
        case 0xc:
          std::operator<<(local_218,"-: contract violation");
          break;
        case 0xd:
          std::operator<<(local_218,"sub1: contract violation");
          break;
        case 0xe:
          std::operator<<(local_218,"invalid program termination");
          break;
        case 0xf:
          std::operator<<(local_218,"closure expected");
          break;
        case 0x10:
          std::operator<<(local_218,"vector-ref: contract violation");
          break;
        case 0x11:
          std::operator<<(local_218,"vector-ref: out of bounds");
          break;
        case 0x12:
          std::operator<<(local_218,"vector-set!: contract violation");
          break;
        case 0x13:
          std::operator<<(local_218,"vector-set!: out of bounds");
          break;
        case 0x14:
          std::operator<<(local_218,"closure-ref: contract violation");
          break;
        case 0x15:
          std::operator<<(local_218,"closure-ref: out of bounds");
          break;
        case 0x16:
          std::operator<<(local_218,"zero?: contract violation");
          break;
        case 0x17:
          std::operator<<(local_218,"cons: contract violation");
          break;
        case 0x18:
          std::operator<<(local_218,"car: contract violation");
          break;
        case 0x19:
          std::operator<<(local_218,"cdr: contract violation");
          break;
        case 0x1a:
          std::operator<<(local_218,"vector: contract violation");
          break;
        case 0x1b:
          std::operator<<(local_218,"make-vector: contract violation");
          break;
        case 0x1c:
          std::operator<<(local_218,"vector-length: contract violation");
          break;
        case 0x1d:
          std::operator<<(local_218,"vector-length: contract violation");
          break;
        case 0x1e:
          std::operator<<(local_218,"make-string: contract violation");
          break;
        case 0x1f:
          std::operator<<(local_218,"string-length: contract violation");
          break;
        case 0x20:
          std::operator<<(local_218,"string-ref: contract violation");
          break;
        case 0x21:
          std::operator<<(local_218,"string-ref: out of bounds");
          break;
        case 0x22:
          std::operator<<(local_218,"string-set!: contract violation");
          break;
        case 0x23:
          std::operator<<(local_218,"string-set!: out of bounds");
          break;
        case 0x24:
          std::operator<<(local_218,"eq?: contract violation");
          break;
        case 0x25:
          std::operator<<(local_218,"eqv?: contract violation");
          break;
        case 0x26:
          std::operator<<(local_218,"%eqv?: contract violation");
          break;
        case 0x27:
          std::operator<<(local_218,"equal?: contract violation");
          break;
        case 0x28:
          std::operator<<(local_218,"length: contract violation");
          break;
        case 0x29:
          std::operator<<(local_218,"set-car!: contract violation");
          break;
        case 0x2a:
          std::operator<<(local_218,"set-cdr!: contract violation");
          break;
        case 0x2b:
          std::operator<<(local_218,"fixnum->char: contract violation");
          break;
        case 0x2c:
          std::operator<<(local_218,"char->fixnum: contract violation");
          break;
        case 0x2d:
          std::operator<<(local_218,"char=?: contract violation");
          break;
        case 0x2e:
          std::operator<<(local_218,"char<?: contract violation");
          break;
        case 0x2f:
          std::operator<<(local_218,"char>?: contract violation");
          break;
        case 0x30:
          std::operator<<(local_218,"char<=?: contract violation");
          break;
        case 0x31:
          std::operator<<(local_218,"char>=?: contract violation");
          break;
        case 0x32:
          std::operator<<(local_218,"fx=?: contract violation");
          break;
        case 0x33:
          std::operator<<(local_218,"fx<?: contract violation");
          break;
        case 0x34:
          std::operator<<(local_218,"fx>?: contract violation");
          break;
        case 0x35:
          std::operator<<(local_218,"fx<=?: contract violation");
          break;
        case 0x36:
          std::operator<<(local_218,"fx>=?: contract violation");
          break;
        case 0x37:
          std::operator<<(local_218,"fx+: contract violation");
          break;
        case 0x38:
          std::operator<<(local_218,"fx-: contract violation");
          break;
        case 0x39:
          std::operator<<(local_218,"fx*: contract violation");
          break;
        case 0x3a:
          std::operator<<(local_218,"fx/: contract violation");
          break;
        case 0x3b:
          std::operator<<(local_218,"fxadd1: contract violation");
          break;
        case 0x3c:
          std::operator<<(local_218,"fxsub1: contract violation");
          break;
        case 0x3d:
          std::operator<<(local_218,"fxzero?: contract violation");
          break;
        case 0x3e:
          std::operator<<(local_218,"bitwise-and: contract violation");
          break;
        case 0x3f:
          std::operator<<(local_218,"bitwise-not: contract violation");
          break;
        case 0x40:
          std::operator<<(local_218,"bitwise-or: contract violation");
          break;
        case 0x41:
          std::operator<<(local_218,"bitwise-xor: contract violation");
          break;
        case 0x42:
          std::operator<<(local_218,"make-vector: heap overflow");
          break;
        case 0x43:
          std::operator<<(local_218,"closure: heap overflow");
          break;
        case 0x44:
          std::operator<<(local_218,"vector: heap overflow");
          break;
        case 0x45:
          std::operator<<(local_218,"make-string: heap overflow");
          break;
        case 0x46:
          std::operator<<(local_218,"string: heap overflow");
          break;
        case 0x47:
          std::operator<<(local_218,"list: heap overflow");
          break;
        case 0x48:
          std::operator<<(local_218,"cons: heap overflow");
          break;
        case 0x49:
          std::operator<<(local_218,"symbol: heap overflow");
          break;
        case 0x4a:
          std::operator<<(local_218,"flonum: heap overflow");
          break;
        case 0x4b:
          std::operator<<(local_218,"foreign-call: contract violation");
          break;
        case 0x4c:
          std::operator<<(local_218,"memv: contract violation");
          break;
        case 0x4d:
          std::operator<<(local_218,"memq: contract violation");
          break;
        case 0x4e:
          std::operator<<(local_218,"member: contract violation");
          break;
        case 0x4f:
          std::operator<<(local_218,"assv: contract violation");
          break;
        case 0x50:
          std::operator<<(local_218,"assq: contract violation");
          break;
        case 0x51:
          std::operator<<(local_218,"assoc: contract violation");
          break;
        case 0x52:
          std::operator<<(local_218,"apply: contract violation");
          break;
        case 0x53:
          std::operator<<(local_218,"make-port: contract violation");
          break;
        case 0x54:
          std::operator<<(local_218,"make-port: heap overflow");
          break;
        case 0x55:
          std::operator<<(local_218,"write-char: contract violation");
          break;
        case 0x56:
          std::operator<<(local_218,"flush-output-port: contract violation");
          break;
        case 0x57:
          std::operator<<(local_218,"ieee754-sign: contract violation");
          break;
        case 0x58:
          std::operator<<(local_218,"ieee754-exponent: contract violation");
          break;
        case 0x59:
          std::operator<<(local_218,"ieee754-mantissa: contract violation");
          break;
        case 0x5a:
          std::operator<<(local_218,"max: contract violation");
          break;
        case 0x5b:
          std::operator<<(local_218,"min: contract violation");
          break;
        case 0x5c:
          std::operator<<(local_218,"arithmetic-shift: contract violation");
          break;
        case 0x5d:
          std::operator<<(local_218,"quotient: contract violation");
          break;
        case 0x5e:
          std::operator<<(local_218,"remainder: contract violation");
          break;
        case 0x5f:
          std::operator<<(local_218,"fixnum->flonum: contract violation");
          break;
        case 0x60:
          std::operator<<(local_218,"flonum->fixnum: contract violation");
          break;
        case 0x61:
          std::operator<<(local_218,"fixnum->flonum: heap overflow");
          break;
        case 0x62:
          std::operator<<(local_218,"ieee754-sin: contract violation");
          break;
        case 99:
          std::operator<<(local_218,"ieee754-cos: contract violation");
          break;
        case 100:
          std::operator<<(local_218,"ieee754-tan: contract violation");
          break;
        case 0x65:
          std::operator<<(local_218,"ieee754-asin: contract violation");
          break;
        case 0x66:
          std::operator<<(local_218,"ieee754-acos: contract violation");
          break;
        case 0x67:
          std::operator<<(local_218,"ieee754-atan1: contract violation");
          break;
        case 0x68:
          std::operator<<(local_218,"ieee754-log: contract violation");
          break;
        case 0x69:
          std::operator<<(local_218,"ieee754-round: contract violation");
          break;
        case 0x6a:
          std::operator<<(local_218,"ieee754-truncate: contract violation");
          break;
        case 0x6b:
          std::operator<<(local_218,"ieee754-sqrt: contract violation");
          break;
        case 0x6c:
          std::operator<<(local_218,"ieee754-pi contract violation");
          break;
        case 0x6d:
          std::operator<<(local_218,"fixnum-expt: contract violation");
          break;
        case 0x6e:
          std::operator<<(local_218,"flonum-expt: contract violation");
          break;
        case 0x6f:
          std::operator<<(local_218,"port?: contract violation");
          break;
        case 0x70:
          std::operator<<(local_218,"input-port?: contract violation");
          break;
        case 0x71:
          std::operator<<(local_218,"output-port?: contract violation");
          break;
        case 0x72:
          std::operator<<(local_218,"open-file: contract violation");
          break;
        case 0x73:
          std::operator<<(local_218,"close-file: contract violation");
          break;
        case 0x74:
          std::operator<<(local_218,"port-ref: contract violation");
          break;
        case 0x75:
          std::operator<<(local_218,"port-ref: out of bounds");
          break;
        case 0x76:
          std::operator<<(local_218,"read-char: contract violation");
          break;
        case 0x77:
          std::operator<<(local_218,"peek-char: contract violation");
          break;
        case 0x78:
          std::operator<<(local_218,"num2str: contract violation");
          break;
        case 0x79:
          std::operator<<(local_218,"str2num: contract violation");
          break;
        case 0x7a:
          std::operator<<(local_218,"write-string: contract violation");
          break;
        case 0x7b:
          std::operator<<(local_218,"string-copy: contract violation");
          break;
        case 0x7c:
          std::operator<<(local_218,"symbol->string: contract violation");
          break;
        case 0x7d:
          std::operator<<(local_218,"symbol->string: heap overflow");
          break;
        case 0x7e:
          std::operator<<(local_218,"string-copy: heap overflow");
          break;
        case 0x7f:
          std::operator<<(local_218,"compare-strings: contract violation");
          break;
        case 0x80:
          std::operator<<(local_218,"compare-strings-ci: contract violation");
          break;
        case 0x81:
          std::operator<<(local_218,"vector-fill!: contract violation");
          break;
        case 0x82:
          std::operator<<(local_218,"string-fill!: contract violation");
          break;
        case 0x83:
          std::operator<<(local_218,"substring: contract violation");
          break;
        case 0x84:
          std::operator<<(local_218,"substring: heap overflow");
          break;
        case 0x85:
          std::operator<<(local_218,"substring: out of bounds");
          break;
        case 0x86:
          std::operator<<(local_218,"string-append: contract violation");
          break;
        case 0x87:
          std::operator<<(local_218,"string-append: heap overflow");
          break;
        case 0x88:
          std::operator<<(local_218,"string-hash: contract violation");
          break;
        case 0x89:
          std::operator<<(local_218,"%allocate-symbol: contract violation");
          break;
        case 0x8a:
          std::operator<<(local_218,"%allocate-symbol: heap overflow");
          break;
        case 0x8b:
          std::operator<<(local_218,"make-promise: contract violation");
          break;
        case 0x8c:
          std::operator<<(local_218,"make-promise: heap overflow");
          break;
        case 0x8d:
          std::operator<<(local_218,"%slot-ref: out of bounds");
          break;
        case 0x8e:
          std::operator<<(local_218,"%slot-ref: contract violation");
          break;
        case 0x8f:
          std::operator<<(local_218,"%slot-set!: out of bounds");
          break;
        case 0x90:
          std::operator<<(local_218,"%slot-set!: contract violation");
          break;
        case 0x91:
          std::operator<<(local_218,"division by zero");
          break;
        case 0x92:
          std::operator<<(local_218,"heap is full");
          break;
        case 0x93:
          std::operator<<(local_218,"load: contract violation");
          break;
        case 0x94:
          std::operator<<(local_218,"%eval: contract violation");
          break;
        case 0x95:
          std::operator<<(local_218,"getenv: contract violation");
          break;
        case 0x96:
          std::operator<<(local_218,"getenv: heap overflow");
          break;
        case 0x97:
          std::operator<<(local_218,"putenv: contract violation");
          break;
        case 0x98:
          std::operator<<(local_218,"file-exists?: contract violation");
          break;
        default:
          std::operator<<(local_218,"unknown error");
        }
        if (p_ctxt != (context *)0x0) {
          std::operator<<(local_218,": ");
        }
        std::shared_ptr<skiwi::environment<skiwi::environment_entry>_>::shared_ptr(&local_5a0,env);
        print_last_global_variable_used(local_218,&local_5a0,rd,p_ctxt);
        std::shared_ptr<skiwi::environment<skiwi::environment_entry>_>::~shared_ptr(&local_5a0);
        std::__cxx11::stringstream::str();
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&todo.
                        super__Vector_base<skiwi::(anonymous_namespace)::task,_std::allocator<skiwi::(anonymous_namespace)::task>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_5c0);
        std::__cxx11::string::~string((string *)&local_5c0);
        goto LAB_004c61cb;
      }
      local_590 = 1;
    }
    std::__cxx11::stringstream::~stringstream(local_228);
    std::__cxx11::string::~string((string *)local_a0);
    if (local_590 != 0) goto LAB_004c62a8;
  }
  this = &todo.
          super__Vector_base<skiwi::(anonymous_namespace)::task,_std::allocator<skiwi::(anonymous_namespace)::task>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage;
  __end2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)this);
  s = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&s), bVar1) {
    pbVar9 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end2);
    std::operator<<(out,(string *)pbVar9);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end2);
  }
  local_590 = 0;
LAB_004c62a8:
  std::
  vector<skiwi::(anonymous_namespace)::task,_std::allocator<skiwi::(anonymous_namespace)::task>_>::
  ~vector((vector<skiwi::(anonymous_namespace)::task,_std::allocator<skiwi::(anonymous_namespace)::task>_>
           *)local_60);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&todo.
                super__Vector_base<skiwi::(anonymous_namespace)::task,_std::allocator<skiwi::(anonymous_namespace)::task>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void print_ptr(uint64_t rax2, std::ostream& out, std::shared_ptr<SKIWI::environment<SKIWI::environment_entry>> env, const repl_data& rd, const context* p_ctxt)
    {
    std::vector<std::string> texts;
    std::vector<task> todo;
    todo.emplace_back(rax2);

    while (!todo.empty())
      {
      uint64_t rax = todo.back().rax;
      int second_item_of_pair = todo.back().second_item_of_pair;
      std::string txt = todo.back().txt;
      todo.pop_back();
      std::stringstream str;
      str << std::setprecision(out.precision());
      if (!txt.empty())
        {
        texts.push_back(txt);
        }
      else if ((rax & fixnum_mask) == fixnum_tag)
        {
        int64_t value = (int64_t)(((int64_t)rax) >> (int64_t)fixnum_shift);
        str << value;
        texts.push_back(str.str());
        }
      else if ((rax & block_mask) == block_tag)
        {
        uint64_t* addr = get_address_from_block(rax);
        uint64_t header = *addr;
        if (block_header_is_flonum(header))
          {
          assert(get_block_size(header) == 1);
          double* d = reinterpret_cast<double*>((uint64_t*)(addr + 1));
          str << std::defaultfloat << *d;
          texts.push_back(str.str());
          }
        else if (block_header_is_closure(header))
          {
          str << "<lambda>";
          texts.push_back(str.str());
          }
        else if (block_header_is_pair(header))
          {
          //In general, the rule for printing a pair is as follows : use the dot notation always,
          //but if the dot is immediately followed by an open parenthesis, then remove the dot, the
          //open parenthesis, and the matching close parenthesis.Thus, (0 . (1 . 2)) becomes
          //(0 1 . 2), and (1 . (2 . (3 . ()))) becomes (1 2 3).
          assert(get_block_size(header) == 2);
          uint64_t first = *((uint64_t*)(addr + 1));
          uint64_t second = *((uint64_t*)(addr + 2));
          if (!second_item_of_pair)
            {
            str << "(";
            texts.push_back(str.str());
            }
          size_t idx0 = todo.size();
          todo.emplace_back(first, 0);
          if (second == nil)
            {
            }
          else
            {
            if (!is_pair(second))
              todo.emplace_back(" . ");
            else
              todo.emplace_back(" ");
            todo.emplace_back(second, 1);
            }
          if (!second_item_of_pair)
            todo.emplace_back(")");
          std::reverse(todo.begin() + idx0, todo.end());
          }
        else if (block_header_is_vector(header))
          {
          str << "#(";
          texts.push_back(str.str());
          size_t idx0 = todo.size();
          for (int i = 0; i < get_block_size(header); ++i)
            {
            if (i)
              todo.emplace_back(" ");
            uint64_t item = *((uint64_t*)(addr + i + 1));
            todo.emplace_back(item, 0);
            }
          todo.emplace_back(")");
          std::reverse(todo.begin() + idx0, todo.end());
          }
        else if (block_header_is_string(header))
          {
          str << "\"";
          char* ch = (char*)(addr + 1);
          str << ch;
          str << "\"";
          texts.push_back(str.str());
          }
        else if (block_header_is_symbol(header))
          {
          char* ch = (char*)(addr + 1);
          str << ch;
          texts.push_back(str.str());
          }
        else if (block_header_is_port(header))
          {
          uint64_t name_address = *((uint64_t*)(addr + 1 + 1));
          str << "<port>: ";
          texts.push_back(str.str());
          todo.emplace_back(name_address, second_item_of_pair);
          }
        else if (block_header_is_promise(header))
          {
          str << "<promise>";
          texts.push_back(str.str());
          }
        else
          {
          str << "<unknown " << uint64_to_hex(rax) << ">";
          texts.push_back(str.str());
          }
        }
      else if (rax == bool_t)
        {
        str << "#t";
        texts.push_back(str.str());
        }
      else if (rax == bool_f)
        {
        str << "#f";
        texts.push_back(str.str());
        }
      else if (rax == nil)
        {
        str << "()";
        texts.push_back(str.str());
        }
      else if ((rax & char_mask) == char_tag)
        {
        unsigned char ch = (unsigned char)(rax >> 8);
        if (ch > 31 && ch < 127)
          str << "#\\" << ch;
        else
          str << "#\\" << std::fixed << std::setfill('0') << std::setw(3) << int(ch) << std::defaultfloat;
        texts.push_back(str.str());
        }
      else if (rax == skiwi_undefined)
        {
        str << "#undefined";
        texts.push_back(str.str());
        }
      else if (rax == skiwi_quiet_undefined)
        {
        }
      else if (rax == eof_tag)
        {
        str << "#eof";
        texts.push_back(str.str());
        }
      else if ((rax & procedure_mask) == procedure_tag)
        {
        str << "<procedure>";
        texts.push_back(str.str());
        }
      else if (rax == unresolved_tag)
        {
        str << "unknown variable";
        if (p_ctxt)
          {
          str << ": ";
          print_last_global_variable_used(str, env, rd, p_ctxt);
          }
        texts.push_back(str.str());
        }
      else if (rax == unalloc_tag)
        {
        str << "compiler error, to check: ";
        if (p_ctxt)
          {
          str << ": ";
          print_last_global_variable_used(str, env, rd, p_ctxt);
          }
        texts.push_back(str.str());
        }
      else if ((rax & error_mask) == error_tag)
        {
        uint64_t error_id = (rax >> 8) & ((1 << 8) - 1);
        //uint64_t original_rax_lowest_48 = (rax >> 16);
        runtime_error re = (runtime_error)error_id;
        if (re == re_silent)
          return;
        str << "runtime error: ";
        switch (re)
          {
          case re_lambda_invalid_number_of_arguments: str << "<lambda>: invalid number of arguments"; break;
          case re_add_contract_violation: str << "+: contract violation"; break;
          case re_add1_contract_violation: str << "add1: contract violation"; break;
          case re_div_contract_violation: str << "/: contract violation"; break;
          case re_mul_contract_violation: str << "*: contract violation"; break;
          case re_equal_contract_violation: str << "=: contract violation"; break;
          case re_not_equal_contract_violation: str << "!=: contract violation"; break;
          case re_less_contract_violation: str << "<: contract violation"; break;
          case re_leq_contract_violation: str << "<=: contract violation"; break;
          case re_greater_contract_violation: str << ">: contract violation"; break;
          case re_geq_contract_violation: str << ">=: contract violation"; break;
          case re_sub_contract_violation: str << "-: contract violation"; break;
          case re_sub1_contract_violation: str << "sub1: contract violation"; break;
          case re_invalid_program_termination: str << "invalid program termination"; break;
          case re_closure_expected: str << "closure expected"; break;
          case re_vector_ref_contract_violation: str << "vector-ref: contract violation"; break;
          case re_vector_ref_out_of_bounds: str << "vector-ref: out of bounds"; break;
          case re_vector_set_contract_violation: str << "vector-set!: contract violation"; break;
          case re_vector_set_out_of_bounds: str << "vector-set!: out of bounds"; break;
          case re_closure_ref_contract_violation: str << "closure-ref: contract violation"; break;
          case re_closure_ref_out_of_bounds: str << "closure-ref: out of bounds"; break;
          case re_is_zero_contract_violation: str << "zero?: contract violation"; break;
          case re_cons_contract_violation: str << "cons: contract violation"; break;
          case re_car_contract_violation: str << "car: contract violation"; break;
          case re_cdr_contract_violation: str << "cdr: contract violation"; break;
          case re_vector_contract_violation: str << "vector: contract violation"; break;
          case re_make_vector_contract_violation: str << "make-vector: contract violation"; break;
          case re_vector_length_contract_violation: str << "vector-length: contract violation"; break;
          case re_string_contract_violation: str << "vector-length: contract violation"; break;
          case re_make_string_contract_violation: str << "make-string: contract violation"; break;
          case re_string_length_contract_violation: str << "string-length: contract violation"; break;
          case re_string_ref_contract_violation: str << "string-ref: contract violation"; break;
          case re_string_ref_out_of_bounds: str << "string-ref: out of bounds"; break;
          case re_string_set_contract_violation: str << "string-set!: contract violation"; break;
          case re_string_set_out_of_bounds: str << "string-set!: out of bounds"; break;
          case re_eq_contract_violation: str << "eq?: contract violation"; break;
          case re_eqv_contract_violation: str << "eqv?: contract violation"; break;
          case re_eqvstruct_contract_violation: str << "%eqv?: contract violation"; break;
          case re_isequal_contract_violation: str << "equal?: contract violation"; break;
          case re_length_contract_violation: str << "length: contract violation"; break;
          case re_set_car_contract_violation: str << "set-car!: contract violation"; break;
          case re_set_cdr_contract_violation: str << "set-cdr!: contract violation"; break;
          case re_fixnum_to_char_contract_violation: str << "fixnum->char: contract violation"; break;
          case re_char_to_fixnum_contract_violation: str << "char->fixnum: contract violation"; break;
          case re_char_equal_contract_violation: str << "char=?: contract violation"; break;
          case re_char_less_contract_violation: str << "char<?: contract violation"; break;
          case re_char_greater_contract_violation: str << "char>?: contract violation"; break;
          case re_char_leq_contract_violation: str << "char<=?: contract violation"; break;
          case re_char_geq_contract_violation: str << "char>=?: contract violation"; break;
          case re_fx_equal_contract_violation: str << "fx=?: contract violation"; break;
          case re_fx_less_contract_violation: str << "fx<?: contract violation"; break;
          case re_fx_greater_contract_violation: str << "fx>?: contract violation"; break;
          case re_fx_leq_contract_violation: str << "fx<=?: contract violation"; break;
          case re_fx_geq_contract_violation: str << "fx>=?: contract violation"; break;
          case re_fx_add_contract_violation: str << "fx+: contract violation"; break;
          case re_fx_sub_contract_violation: str << "fx-: contract violation"; break;
          case re_fx_mul_contract_violation: str << "fx*: contract violation"; break;
          case re_fx_div_contract_violation: str << "fx/: contract violation"; break;
          case re_fx_add1_contract_violation: str << "fxadd1: contract violation"; break;
          case re_fx_sub1_contract_violation: str << "fxsub1: contract violation"; break;
          case re_fx_is_zero_contract_violation: str << "fxzero?: contract violation"; break;
          case re_bitwise_and_contract_violation:str << "bitwise-and: contract violation"; break;
          case re_bitwise_not_contract_violation:str << "bitwise-not: contract violation"; break;
          case re_bitwise_or_contract_violation:str << "bitwise-or: contract violation"; break;
          case re_bitwise_xor_contract_violation:str << "bitwise-xor: contract violation"; break;
          case re_make_vector_heap_overflow: str << "make-vector: heap overflow"; break;
          case re_closure_heap_overflow: str << "closure: heap overflow"; break;
          case re_vector_heap_overflow: str << "vector: heap overflow"; break;
          case re_make_string_heap_overflow: str << "make-string: heap overflow"; break;
          case re_string_heap_overflow: str << "string: heap overflow"; break;
          case re_list_heap_overflow: str << "list: heap overflow"; break;
          case re_cons_heap_overflow: str << "cons: heap overflow"; break;
          case re_symbol_heap_overflow: str << "symbol: heap overflow"; break;
          case re_flonum_heap_overflow: str << "flonum: heap overflow"; break;
          case re_foreign_call_contract_violation: str << "foreign-call: contract violation"; break;
          case re_memv_contract_violation: str << "memv: contract violation"; break;
          case re_memq_contract_violation: str << "memq: contract violation"; break;
          case re_member_contract_violation: str << "member: contract violation"; break;
          case re_assv_contract_violation: str << "assv: contract violation"; break;
          case re_assq_contract_violation: str << "assq: contract violation"; break;
          case re_assoc_contract_violation: str << "assoc: contract violation"; break;
          case re_apply_contract_violation: str << "apply: contract violation"; break;
          case re_make_port_contract_violation: str << "make-port: contract violation"; break;
          case re_make_port_heap_overflow: str << "make-port: heap overflow"; break;
          case re_write_char_contract_violation: str << "write-char: contract violation"; break;
          case re_flush_output_port_contract_violation: str << "flush-output-port: contract violation"; break;
          case re_ieee754_sign_contract_violation: str << "ieee754-sign: contract violation"; break;
          case re_ieee754_exponent_contract_violation: str << "ieee754-exponent: contract violation"; break;
          case re_ieee754_mantissa_contract_violation: str << "ieee754-mantissa: contract violation"; break;
          case re_max_contract_violation: str << "max: contract violation"; break;
          case re_min_contract_violation: str << "min: contract violation"; break;
          case re_arithmetic_shift_contract_violation: str << "arithmetic-shift: contract violation"; break;
          case re_quotient_contract_violation: str << "quotient: contract violation"; break;
          case re_remainder_contract_violation: str << "remainder: contract violation"; break;
          case re_fixnum_to_flonum_contract_violation: str << "fixnum->flonum: contract violation"; break;
          case re_flonum_to_fixnum_contract_violation: str << "flonum->fixnum: contract violation"; break;
          case re_fixnum_to_flonum_heap_overflow: str << "fixnum->flonum: heap overflow"; break;
          case re_ieee754_sin_contract_violation: str << "ieee754-sin: contract violation"; break;
          case re_ieee754_cos_contract_violation: str << "ieee754-cos: contract violation"; break;
          case re_ieee754_tan_contract_violation: str << "ieee754-tan: contract violation"; break;
          case re_ieee754_asin_contract_violation: str << "ieee754-asin: contract violation"; break;
          case re_ieee754_acos_contract_violation: str << "ieee754-acos: contract violation"; break;
          case re_ieee754_atan1_contract_violation: str << "ieee754-atan1: contract violation"; break;
          case re_ieee754_log_contract_violation: str << "ieee754-log: contract violation"; break;
          case re_ieee754_round_contract_violation: str << "ieee754-round: contract violation"; break;
          case re_ieee754_truncate_contract_violation: str << "ieee754-truncate: contract violation"; break;
          case re_ieee754_sqrt_contract_violation: str << "ieee754-sqrt: contract violation"; break;
          case re_ieee754_pi_contract_violation: str << "ieee754-pi contract violation"; break;
          case re_fixnum_expt_contract_violation: str << "fixnum-expt: contract violation"; break;
          case re_flonum_expt_contract_violation: str << "flonum-expt: contract violation"; break;
          case re_is_port_contract_violation: str << "port?: contract violation"; break;
          case re_is_input_port_contract_violation: str << "input-port?: contract violation"; break;
          case re_is_output_port_contract_violation: str << "output-port?: contract violation"; break;
          case re_open_file_contract_violation: str << "open-file: contract violation"; break;
          case re_close_file_contract_violation: str << "close-file: contract violation"; break;
          case re_port_ref_contract_violation: str << "port-ref: contract violation"; break;
          case re_port_ref_out_of_bounds: str << "port-ref: out of bounds"; break;
          case re_read_char_contract_violation: str << "read-char: contract violation"; break;
          case re_peek_char_contract_violation: str << "peek-char: contract violation"; break;
          case re_num2str_contract_violation: str << "num2str: contract violation"; break;
          case re_str2num_contract_violation: str << "str2num: contract violation"; break;
          case re_write_string_contract_violation: str << "write-string: contract violation"; break;
          case re_string_copy_contract_violation: str << "string-copy: contract violation"; break;
          case re_symbol_to_string_contract_violation: str << "symbol->string: contract violation"; break;
          case re_string_copy_heap_overflow: str << "string-copy: heap overflow"; break;
          case re_symbol_to_string_heap_overflow: str << "symbol->string: heap overflow"; break;
          case re_compare_strings_contract_violation: str << "compare-strings: contract violation"; break;
          case re_compare_strings_ci_contract_violation: str << "compare-strings-ci: contract violation"; break;
          case re_vector_fill_contract_violation: str << "vector-fill!: contract violation"; break;
          case re_string_fill_contract_violation: str << "string-fill!: contract violation"; break;
          case re_substring_contract_violation: str << "substring: contract violation"; break;
          case re_substring_heap_overflow: str << "substring: heap overflow"; break;
          case re_substring_out_of_bounds: str << "substring: out of bounds"; break;
          case re_string_append_contract_violation: str << "string-append: contract violation"; break;
          case re_string_append_heap_overflow: str << "string-append: heap overflow"; break;
          case re_string_hash_contract_violation: str << "string-hash: contract violation"; break;
          case re_allocate_symbol_contract_violation: str << "%allocate-symbol: contract violation"; break;
          case re_allocate_symbol_heap_overflow: str << "%allocate-symbol: heap overflow"; break;
          case re_make_promise_contract_violation: str << "make-promise: contract violation"; break;
          case re_make_promise_heap_overflow: str << "make-promise: heap overflow"; break;
          case re_slot_ref_out_of_bounds:str << "%slot-ref: out of bounds"; break;
          case re_slot_ref_contract_violation: str << "%slot-ref: contract violation"; break;
          case re_slot_set_out_of_bounds:str << "%slot-set!: out of bounds"; break;
          case re_slot_set_contract_violation: str << "%slot-set!: contract violation"; break;
          case re_division_by_zero: str << "division by zero"; break;
          case re_heap_full: str << "heap is full"; break;
          case re_load_contract_violation: str << "load: contract violation"; break;
          case re_eval_contract_violation: str << "%eval: contract violation"; break;
          case re_getenv_contract_violation: str << "getenv: contract violation"; break;
          case re_getenv_heap_overflow: str << "getenv: heap overflow"; break;
          case re_putenv_contract_violation: str << "putenv: contract violation"; break;
          case re_file_exists_contract_violation: str << "file-exists?: contract violation"; break;
          default: str << "unknown error"; break;
          }
        if (p_ctxt)
          str << ": ";
        print_last_global_variable_used(str, env, rd, p_ctxt);
        //str << "\nInstead I got ";
        texts.push_back(str.str());
        //todo.emplace_back(original_rax_lowest_48, 0);        
        }
      else
        {
        str << "<unknown " << uint64_to_hex(rax) << ">";
        texts.push_back(str.str());
        }
      }
    for (const auto& s : texts)
      out << s;
    }